

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

GLvoid __thiscall
gl4cts::anon_unknown_0::GatherBase::CreateTexture2D(GatherBase *this,bool rect,bool base_level)

{
  int internalformat;
  GLenum format_00;
  int width;
  GLenum target_00;
  reference pixels_00;
  undefined1 local_b8 [8];
  Vec4 data [4];
  allocator<tcu::Vector<float,_4>_> local_59;
  Vector<float,_4> local_58;
  undefined1 local_48 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixels;
  int i;
  GLenum target;
  GLint size;
  GLint csize;
  GLenum format;
  GLenum internal_format;
  bool base_level_local;
  bool rect_local;
  GatherBase *this_local;
  
  internalformat = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])()
  ;
  format_00 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x22])();
  width = 0x20;
  if (base_level) {
    width = 0x40;
  }
  target_00 = 0xde1;
  if (rect) {
    target_00 = 0x84f5;
  }
  glu::CallLogWrapper::glGenTextures
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->tex);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,target_00,
             this->tex);
  if (rect) {
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               target_00,0,internalformat,width,width,0,format_00,0x1406,(void *)0x0);
  }
  else {
    pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    for (i = width; 0 < i; i = i / 2) {
      glu::CallLogWrapper::glTexImage2D
                (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                 target_00,
                 pixels.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,internalformat,i,i,0,
                 format_00,0x1406,(void *)0x0);
      pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    }
  }
  tcu::Vector<float,_4>::Vector(&local_58,1.0);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_59);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_48,
             (long)(width * width),&local_58,&local_59);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_59);
  pixels_00 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_48,0);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,target_00,
             0,0,0,width,width,format_00,0x1406,pixels_00);
  if ((!rect) && (format_00 != 0x1902)) {
    glu::CallLogWrapper::glGenerateMipmap
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               target_00);
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_b8,0.75,0.8125,0.875,0.9375);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data[0].m_data + 2),0.5,0.5625,0.625,0.6875);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data[1].m_data + 2),0.0,0.0625,0.125,0.1875);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data[2].m_data + 2),0.25,0.3125,0.375,0.4375);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,target_00,
             base_level & 1,0x16,0x19,2,2,format_00,0x1406,local_b8);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,target_00,
             base_level & 1,0x10,10,1,1,format_00,0x1406,local_b8);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,target_00,
             base_level & 1,0xb,2,1,1,format_00,0x1406,data[0].m_data + 2);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,target_00,
             base_level & 1,0x18,0xd,1,1,format_00,0x1406,data[1].m_data + 2);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,target_00,
             base_level & 1,9,0xe,1,1,format_00,0x1406,data[2].m_data + 2);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,target_00,
             0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,target_00,
             0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,target_00,
             0x8072,0x812f);
  if (base_level) {
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               target_00,0x813c,1);
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_48);
  return;
}

Assistant:

virtual GLvoid CreateTexture2D(bool rect = false, bool base_level = false)
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= Format();
		const GLint csize			= base_level ? 64 : 32;
		GLint		size			= csize;
		GLenum		target			= rect ? GL_TEXTURE_RECTANGLE : GL_TEXTURE_2D;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		if (!rect)
		{
			for (int i = 0; size > 0; ++i, size /= 2)
			{
				glTexImage2D(target, i, internal_format, size, size, 0, format, GL_FLOAT, 0);
			}
		}
		else
		{
			glTexImage2D(target, 0, internal_format, size, size, 0, format, GL_FLOAT, 0);
		}
		std::vector<Vec4> pixels(csize * csize, Vec4(1.0));
		glTexSubImage2D(target, 0, 0, 0, csize, csize, format, GL_FLOAT, &pixels[0]);

		if (!rect && format != GL_DEPTH_COMPONENT)
		{
			glGenerateMipmap(target);
		}

		Vec4 data[4] = { Vec4(12. / 16, 13. / 16, 14. / 16, 15. / 16), Vec4(8. / 16, 9. / 16, 10. / 16, 11. / 16),
						 Vec4(0. / 16, 1. / 16, 2. / 16, 3. / 16), Vec4(4. / 16, 5. / 16, 6. / 16, 7. / 16) };

		glTexSubImage2D(target, base_level, 22, 25, 2, 2, format, GL_FLOAT, data);
		glTexSubImage2D(target, base_level, 16, 10, 1, 1, format, GL_FLOAT, data + 0);
		glTexSubImage2D(target, base_level, 11, 2, 1, 1, format, GL_FLOAT, data + 1);
		glTexSubImage2D(target, base_level, 24, 13, 1, 1, format, GL_FLOAT, data + 2);
		glTexSubImage2D(target, base_level, 9, 14, 1, 1, format, GL_FLOAT, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);

		if (base_level)
			glTexParameteri(target, GL_TEXTURE_BASE_LEVEL, 1);
	}